

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O0

shared_ptr<spdlog::logger> __thiscall spdlog::details::registry::default_logger(registry *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<spdlog::logger> *in_RSI;
  element_type *in_RDI;
  shared_ptr<spdlog::logger> sVar1;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RSI,in_stack_ffffffffffffffc8);
  std::shared_ptr<spdlog::logger>::shared_ptr
            (in_RSI,(shared_ptr<spdlog::logger> *)in_stack_ffffffffffffffc8);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1d51cf);
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<spdlog::logger>)
         sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SPDLOG_INLINE std::shared_ptr<logger> registry::default_logger()
{
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    return default_logger_;
}